

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverageClipper.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int maxDepth;
  ostream *poVar2;
  string *this;
  allocator local_9b;
  allocator local_9a;
  allocator local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  string local_58;
  string local_38;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Starting Coverage Clipper");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::string((string *)&local_98,argv[1],&local_9b);
  bVar1 = std::operator==(&local_98,"--c");
  std::__cxx11::string::~string((string *)&local_98);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Clipping coverage: ");
    poVar2 = std::operator<<(poVar2,argv[2]);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::string((string *)&local_38,argv[2],&local_9b);
    std::__cxx11::string::string((string *)&local_58,argv[3],&local_99);
    std::__cxx11::string::string((string *)&local_98,argv[4],&local_9a);
    maxDepth = std::__cxx11::stoi(&local_98,(size_t *)0x0,10);
    clipCoverage(&local_38,&local_58,maxDepth);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_58);
    this = &local_38;
  }
  else {
    std::__cxx11::string::string((string *)&local_98,argv[1],&local_9b);
    bVar1 = std::operator==(&local_98,"--f");
    std::__cxx11::string::~string((string *)&local_98);
    if (!bVar1) goto LAB_00103a57;
    poVar2 = std::operator<<((ostream *)&std::cout,"Counting max depth: ");
    poVar2 = std::operator<<(poVar2,argv[2]);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::string((string *)&local_78,argv[2],(allocator *)&local_98);
    countCoverage(&local_78);
    this = &local_78;
  }
  std::__cxx11::string::~string((string *)this);
LAB_00103a57:
  poVar2 = std::operator<<((ostream *)&std::cout,"Ended Coverage Clipper");
  std::endl<char,std::char_traits<char>>(poVar2);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {


    cout << "Starting Coverage Clipper"<<endl;
    if(std::string(argv[1]) == "--c"){
        cout<<"Clipping coverage: "<<argv[2]<<endl;
        clipCoverage(argv[2],argv[3],stoi(argv[4]));
    }else if(std::string(argv[1]) == "--f"){
        cout<<"Counting max depth: "<<argv[2]<<endl;
        countCoverage(argv[2]);
    }

    cout << "Ended Coverage Clipper"<< endl;


}